

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall duckdb::Appender::ClearColumns(Appender *this)

{
  vector<duckdb::LogicalType,_true> *this_00;
  pointer pLVar1;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> __p;
  pointer in_RAX;
  vector<duckdb::LogicalType,_true> *args_1;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  BaseAppender::Flush(&this->super_BaseAppender);
  pLVar1 = (this->column_ids).
           super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
           super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->column_ids).super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
      super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
      super__Vector_impl_data._M_finish != pLVar1) {
    (this->column_ids).super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
    super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar1;
  }
  this_00 = &(this->super_BaseAppender).active_types;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::clear
            (&this_00->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  BaseAppender::InitializeChunk(&this->super_BaseAppender);
  args_1 = &(this->super_BaseAppender).types;
  if ((this->super_BaseAppender).active_types.
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->super_BaseAppender).active_types.
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    args_1 = this_00;
  }
  make_uniq<duckdb::ColumnDataCollection,duckdb::Allocator&,duckdb::vector<duckdb::LogicalType,true>const&>
            ((duckdb *)&local_18,(this->super_BaseAppender).allocator,args_1);
  __p._M_head_impl = local_18._M_head_impl;
  local_18._M_head_impl = (ColumnDataCollection *)0x0;
  ::std::
  __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
           *)&(this->super_BaseAppender).collection,__p._M_head_impl);
  ::std::
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>::
  ~unique_ptr((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
               *)&local_18);
  return;
}

Assistant:

void Appender::ClearColumns() {
	Flush();
	column_ids.clear();
	active_types.clear();

	InitializeChunk();
	collection = make_uniq<ColumnDataCollection>(allocator, GetActiveTypes());
}